

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::JunitReporter::testGroupStarting(JunitReporter *this,GroupInfo *groupInfo)

{
  uint64_t uVar1;
  allocator local_29;
  string local_28 [32];
  
  uVar1 = anon_unknown_24::getCurrentTicks();
  (this->suiteTimer).m_ticks = uVar1;
  std::__cxx11::string::string(local_28,"",&local_29);
  std::__cxx11::stringbuf::str((string *)&this->field_0x118);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string(local_28,"",&local_29);
  std::__cxx11::stringbuf::str((string *)&this->field_0x290);
  std::__cxx11::string::~string(local_28);
  this->unexpectedExceptions = 0;
  return;
}

Assistant:

virtual void testGroupStarting( GroupInfo const& groupInfo ) {
            suiteTimer.start();
            stdOutForSuite.str("");
            stdErrForSuite.str("");
            unexpectedExceptions = 0;
            CumulativeReporterBase::testGroupStarting( groupInfo );
        }